

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.h
# Opt level: O2

void __thiscall PointBlock<3U>::PointBlock(PointBlock<3U> *this,Bounds *bounds_)

{
  diy::Bounds<float>::Bounds(&this->bounds,bounds_);
  diy::Bounds<float>::Bounds(&this->box,3);
  (this->points).super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->points).super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->points).super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

PointBlock(const Bounds& bounds_):
        bounds(bounds_)                         {}